

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumain.cpp
# Opt level: O3

void cu_stop_tracing(int param_1)

{
  ulong *puVar1;
  char **ppcVar2;
  long lVar3;
  bool bVar4;
  vector<Sample,_std::allocator<Sample>_> *pvVar5;
  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  FILE *__s;
  tm *__tp;
  size_t sVar12;
  undefined8 *puVar13;
  _Rb_tree_header *p_Var14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  _Base_ptr p_Var20;
  ulong uVar21;
  pointer pSVar22;
  char timestr [26];
  time_t global_time;
  utsname uts;
  char default_path [32];
  ushort *local_298;
  long local_290;
  ushort local_288 [8];
  char **local_278;
  long local_270;
  char *local_268;
  long lStack_260;
  uint local_24c;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ulong *local_228;
  undefined8 local_220;
  ulong local_218;
  undefined8 uStack_210;
  char **local_208;
  long local_200;
  char *local_1f8 [2];
  pointer local_1e8;
  utsname local_1e0;
  char local_58 [40];
  
  LOCK();
  tracing_enabled._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  if (samples == (vector<Sample,_std::allocator<Sample>_> *)0x0) {
    tracing_enabled = (atomic<bool>)0x0;
    return;
  }
  if (symbols_abi_cxx11_ ==
      (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    tracing_enabled = (atomic<bool>)0x0;
    return;
  }
  pcVar11 = getenv("CU_FILE");
  if (pcVar11 == (char *)0x0) {
    uVar9 = getpid();
    pcVar11 = local_58;
    snprintf(pcVar11,0x20,"./culog-%d.json",(ulong)uVar9);
  }
  __s = fopen(pcVar11,"w");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"cpuusage: unable to write to output path \'%s\'\n",pcVar11);
    goto LAB_00103f07;
  }
  fwrite("{\n",2,1,__s);
  fwrite("\"otherData\": {\n",0xf,1,__s);
  time((time_t *)&local_248);
  __tp = localtime((time_t *)&local_248);
  strftime((char *)&local_278,0x1a,"%Y-%m-%d %H:%M:%S %z",__tp);
  local_1e0.sysname._0_8_ = local_1e0.sysname + 0x10;
  sVar12 = strlen((char *)&local_278);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,&local_278,(long)&local_278 + sVar12);
  fprintf(__s,"  \"timestamp\":\"%s\",\n",local_1e0.sysname._0_8_);
  if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
    operator_delete((void *)local_1e0.sysname._0_8_);
  }
  iVar10 = uname(&local_1e0);
  if (iVar10 == 0) {
    local_248 = local_238;
    sVar12 = strlen(local_1e0.sysname);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,&local_1e0,local_1e0.sysname + sVar12);
    local_288[0] = 0x20;
    local_290 = 1;
    uVar18 = 0xf;
    if (local_248 != local_238) {
      uVar18 = local_238[0];
    }
    local_298 = local_288;
    if ((local_240 + 1U < 0x10) && (uVar18 < local_240 + 1U)) {
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_248);
    }
    else {
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_288);
    }
    local_278 = &local_268;
    ppcVar2 = (char **)(puVar13 + 2);
    if ((char **)*puVar13 == ppcVar2) {
      local_268 = *ppcVar2;
      lStack_260 = puVar13[3];
    }
    else {
      local_268 = *ppcVar2;
      local_278 = (char **)*puVar13;
    }
    local_270 = puVar13[1];
    *puVar13 = ppcVar2;
    puVar13[1] = 0;
    *(undefined1 *)ppcVar2 = 0;
    local_208 = local_1f8;
    sVar12 = strlen(local_1e0.release);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1e0.release,local_1e0.release + sVar12);
    pcVar11 = (char *)0xf;
    if (local_278 != &local_268) {
      pcVar11 = local_268;
    }
    if (pcVar11 < (char *)(local_200 + local_270)) {
      pcVar11 = (char *)0xf;
      if (local_208 != local_1f8) {
        pcVar11 = local_1f8[0];
      }
      if (pcVar11 < (char *)(local_200 + local_270)) goto LAB_00103943;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_278);
    }
    else {
LAB_00103943:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_208);
    }
    local_228 = &local_218;
    puVar1 = puVar13 + 2;
    if ((ulong *)*puVar13 == puVar1) {
      local_218 = *puVar1;
      uStack_210 = puVar13[3];
    }
    else {
      local_218 = *puVar1;
      local_228 = (ulong *)*puVar13;
    }
    local_220 = puVar13[1];
    *puVar13 = puVar1;
    puVar13[1] = 0;
    *(undefined1 *)puVar1 = 0;
    if (local_208 != local_1f8) {
      operator_delete(local_208);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if (local_298 != local_288) {
      operator_delete(local_298);
    }
    if (local_248 != local_238) {
      operator_delete(local_248);
    }
  }
  else {
    local_228 = &local_218;
    local_220 = 0;
    local_218 = local_218 & 0xffffffffffffff00;
  }
  fprintf(__s,"  \"os\":\"%s\",\n",local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  uVar9 = std::thread::hardware_concurrency();
  fprintf(__s,"  \"cores\":\"%d\"\n",(ulong)uVar9);
  fwrite("},\n",3,1,__s);
  fwrite("\"traceEvents\": [\n",0x11,1,__s);
  local_24c = getpid();
  pSVar22 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pSVar22 != local_1e8) {
    bVar8 = true;
    do {
      if (bVar8) {
        sVar12 = 2;
        pcVar11 = "  ";
      }
      else {
        sVar12 = 4;
        pcVar11 = ",\n  ";
      }
      fwrite(pcVar11,sVar12,1,__s);
      bVar8 = pSVar22->enter;
      ppcVar2 = (char **)pSVar22->func;
      local_298 = local_288;
      local_290 = 0;
      local_288[0] = local_288[0] & 0xff00;
      p_Var16 = (symbols_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_208 = ppcVar2;
      if (p_Var16 == (_Base_ptr)0x0) {
LAB_00103b37:
        iVar10 = dladdr(ppcVar2,&local_278);
        if (local_268 == (char *)0x0 || iVar10 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1e0.sysname + 0x10),"0x",2);
          lVar3 = *(long *)(CONCAT44(local_1e0.sysname._20_4_,
                                     CONCAT13(local_1e0.sysname[0x13],
                                              CONCAT12(local_1e0.sysname[0x12],
                                                       local_1e0.sysname._16_2_))) + -0x18);
          *(uint *)(local_1e0.sysname + lVar3 + 0x28) =
               *(uint *)(local_1e0.sysname + lVar3 + 0x28) & 0xffffffb5 | 8;
          std::ostream::_M_insert<unsigned_long_long>((ulonglong)(local_1e0.sysname + 0x10));
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&local_298,(string *)&local_248);
          if (local_248 != local_238) {
            operator_delete(local_248);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_1e0);
          std::ios_base::~ios_base((ios_base *)(local_1e0.nodename + 0x3f));
        }
        else {
          if (*local_268 == '_') {
            local_248 = (ulong *)CONCAT44(local_248._4_4_,0xffffffff);
            pcVar11 = (char *)__cxa_demangle(local_268,0,0,&local_248);
            if (pcVar11 != (char *)0x0) {
              if ((int)local_248 == 0) {
                local_1e0.sysname._0_8_ = local_1e0.sysname + 0x10;
                sVar12 = strlen(pcVar11);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1e0,pcVar11,pcVar11 + sVar12);
                std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1e0);
                if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
                  operator_delete((void *)local_1e0.sysname._0_8_);
                }
              }
              free(pcVar11);
            }
          }
          pcVar11 = local_1e0.sysname + 0x10;
          if (local_290 == 0) {
            std::__cxx11::string::string((string *)&local_1e0,local_268,(allocator *)&local_248);
            std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1e0);
            if ((char *)local_1e0.sysname._0_8_ != pcVar11) {
              operator_delete((void *)local_1e0.sysname._0_8_);
            }
            if (local_290 == 0) goto LAB_00103e48;
          }
          builtin_strncpy(local_1e0.sysname + 0x10," + ",4);
          local_1e0.sysname[8] = '\x03';
          local_1e0.sysname[9] = '\0';
          local_1e0.sysname[10] = '\0';
          local_1e0.sysname[0xb] = '\0';
          local_1e0.sysname[0xc] = '\0';
          local_1e0.sysname[0xd] = '\0';
          local_1e0.sysname[0xe] = '\0';
          local_1e0.sysname[0xf] = '\0';
          local_1e0.sysname._0_8_ = pcVar11;
          std::__cxx11::string::_M_append((char *)&local_298,(ulong)pcVar11);
          if ((char *)local_1e0.sysname._0_8_ != pcVar11) {
            operator_delete((void *)local_1e0.sysname._0_8_);
          }
          uVar21 = (long)ppcVar2 - lStack_260;
          uVar18 = -uVar21;
          if (0 < (long)uVar21) {
            uVar18 = uVar21;
          }
          uVar9 = 1;
          if (9 < uVar18) {
            uVar17 = uVar18;
            uVar7 = 4;
            do {
              uVar9 = uVar7;
              if (uVar17 < 100) {
                uVar9 = uVar9 - 2;
                goto LAB_00103dd5;
              }
              if (uVar17 < 1000) {
                uVar9 = uVar9 - 1;
                goto LAB_00103dd5;
              }
              if (uVar17 < 10000) goto LAB_00103dd5;
              bVar4 = 99999 < uVar17;
              uVar17 = uVar17 / 10000;
              uVar7 = uVar9 + 4;
            } while (bVar4);
            uVar9 = uVar9 + 1;
          }
LAB_00103dd5:
          local_1e0.sysname._0_8_ = local_1e0.sysname + 0x10;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_1e0,(char)uVar9 - (char)((long)uVar21 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)(local_1e0.sysname._0_8_ + -((long)uVar21 >> 0x3f)),uVar9,uVar18);
          std::__cxx11::string::_M_append((char *)&local_298,local_1e0.sysname._0_8_);
          if ((char *)local_1e0.sysname._0_8_ != local_1e0.sysname + 0x10) {
            operator_delete((void *)local_1e0.sysname._0_8_);
          }
        }
LAB_00103e48:
        pmVar15 = std::
                  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](symbols_abi_cxx11_,&local_208);
        std::__cxx11::string::_M_assign((string *)pmVar15);
      }
      else {
        p_Var14 = &(symbols_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
        p_Var20 = &p_Var14->_M_header;
        do {
          if (*(char ***)(p_Var16 + 1) >= ppcVar2) {
            p_Var20 = p_Var16;
          }
          p_Var16 = (&p_Var16->_M_left)[*(char ***)(p_Var16 + 1) < ppcVar2];
        } while (p_Var16 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var20 == p_Var14) || (ppcVar2 < *(char ***)(p_Var20 + 1)))
        goto LAB_00103b37;
        std::__cxx11::string::_M_assign((string *)&local_298);
      }
      bVar19 = bVar8 ^ 1;
      fprintf(__s,
              "{ \"ph\":\"%c\", \"cat\":\"perf\", \"pid\":\"%d\", \"tid\":\"%p\", \"name\":\"%s\", \"ts\":%ld }"
              ,(ulong)((uint)bVar19 + (uint)bVar19 * 2 + 0x42),(ulong)local_24c,pSVar22->thread,
              local_298,pSVar22->ts);
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      pSVar22 = pSVar22 + 1;
      bVar8 = false;
    } while (pSVar22 != local_1e8);
  }
  fputc(10,__s);
  fwrite("]\n",2,1,__s);
  fwrite("}\n",2,1,__s);
  fclose(__s);
LAB_00103f07:
  pvVar5 = samples;
  if ((samples != (vector<Sample,_std::allocator<Sample>_> *)0x0) &&
     (pSVar22 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
                super__Vector_impl_data._M_start, pSVar22 != (pointer)0x0)) {
    operator_delete(pSVar22);
  }
  operator_delete(pvVar5);
  pmVar6 = symbols_abi_cxx11_;
  if (symbols_abi_cxx11_ !=
      (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    std::
    _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&symbols_abi_cxx11_->_M_t);
  }
  operator_delete(pmVar6);
  count_samples = 0;
  symbols_abi_cxx11_ =
       (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  samples = (vector<Sample,_std::allocator<Sample>_> *)0x0;
  return;
}

Assistant:

static void cu_stop_tracing(int)
{
  tracing_enabled = false;

  if ((samples != NULL) && (symbols != NULL))
  {
    cu_trace_report();
    delete samples;
    delete symbols;
    samples = NULL;
    symbols = NULL;
    count_samples = 0;
  }
}